

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall ThreadContext::ClearInvalidatedUniqueGuards(ThreadContext *this)

{
  int iVar1;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  *pWVar2;
  PropertyGuardEntry *pPVar3;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
  *pSVar4;
  ulong *puVar5;
  int i;
  bool bVar6;
  RecyclableData *pRVar7;
  Type pcVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int local_34;
  
  pRVar7 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  for (lVar11 = 0; lVar11 < (pRVar7->propertyGuards).size; lVar11 = lVar11 + 1) {
    iVar1 = (pRVar7->propertyGuards).buckets.ptr[lVar11];
    if (iVar1 != -1) {
      iVar10 = -1;
      while (i = iVar1, i != -1) {
        pWVar2 = (pRVar7->propertyGuards).entries.ptr;
        pcVar8 = ((pWVar2[i].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
        if (pcVar8 == (Type)0x0) {
          iVar1 = pWVar2[i].next;
          JsUtil::
          WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
          ::RemoveEntry(&pRVar7->propertyGuards,i,iVar10,(uint)lVar11);
        }
        else {
          pPVar3 = pWVar2[i].value.ptr;
          pcVar8 = pcVar8 + 0x18;
          for (uVar9 = 0;
              uVar9 < (pPVar3->uniqueGuards).
                      super_BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      .bucketCount; uVar9 = uVar9 + 1) {
            iVar1 = (pPVar3->uniqueGuards).
                    super_BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    .buckets.ptr[uVar9];
            if (iVar1 != -1) {
              local_34 = -1;
              while (iVar10 = iVar1, iVar10 != -1) {
                pSVar4 = (pPVar3->uniqueGuards).
                         super_BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                         .entries.ptr;
                puVar5 = (ulong *)((pSVar4[iVar10].
                                    super_DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                                    .
                                    super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                                    .
                                    super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
                                    .
                                    super_ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                                    .value.ptr)->super_RecyclerWeakReferenceBase).strongRef;
                if ((puVar5 == (ulong *)0x0) || ((*puVar5 & 0xfffffffffffffffd) != 0)) {
                  iVar1 = pSVar4[iVar10].
                          super_DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                          .
                          super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                          .
                          super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
                          .
                          super_ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                          .next;
                  local_34 = iVar10;
                }
                else {
                  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TracePropertyGuardsPhase);
                  if ((bVar6) ||
                     ((bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,FixedMethodsPhase),
                      bVar6 && (DAT_0145948a == '\x01')))) {
                    Output::Print(L"FixedFields: invalidating guard: name: %s, address: 0x%p, value: 0x%p, value address: 0x%p\n"
                                  ,pcVar8,puVar5,*puVar5,puVar5);
                    Output::Flush();
                  }
                  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,TracePropertyGuardsPhase);
                  if ((bVar6) ||
                     ((bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,FixedMethodsPhase),
                      bVar6 && (DAT_0145948a == '\x01')))) {
                    Output::Print(L"FixedFields: invalidating guard: name: %s, value: 0x%p\n",pcVar8
                                  ,*puVar5);
                    Output::Flush();
                  }
                  iVar1 = (pPVar3->uniqueGuards).
                          super_BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                          .entries.ptr[iVar10].
                          super_DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                          .
                          super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                          .
                          super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
                          .
                          super_ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                          .next;
                  JsUtil::
                  BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::RemoveAt(&(pPVar3->uniqueGuards).
                              super_BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             ,iVar10,local_34,(uint)uVar9);
                }
              }
            }
          }
          iVar1 = pWVar2[i].next;
          iVar10 = i;
        }
      }
    }
  }
  return;
}

Assistant:

void
ThreadContext::ClearInvalidatedUniqueGuards()
{
    // If a propertyGuard was invalidated, make sure to remove it's entry from unique property guard table of other property records.
    PropertyGuardDictionary &guards = this->recyclableData->propertyGuards;

    guards.Map([this](Js::PropertyRecord const * propertyRecord, PropertyGuardEntry* entry, const RecyclerWeakReference<const Js::PropertyRecord>* weakRef)
    {
        entry->uniqueGuards.MapAndRemoveIf([=](RecyclerWeakReference<Js::PropertyGuard>* guardWeakRef)
        {
            Js::PropertyGuard* guard = guardWeakRef->Get();
            bool shouldRemove = guard != nullptr && !guard->IsValid();
            if (shouldRemove)
            {
                if (PHASE_TRACE1(Js::TracePropertyGuardsPhase) || PHASE_VERBOSE_TRACE1(Js::FixedMethodsPhase))
                {
                    Output::Print(_u("FixedFields: invalidating guard: name: %s, address: 0x%p, value: 0x%p, value address: 0x%p\n"),
                                  propertyRecord->GetBuffer(), guard, guard->GetValue(), guard->GetAddressOfValue());
                    Output::Flush();
                }
                if (PHASE_TESTTRACE1(Js::TracePropertyGuardsPhase) || PHASE_VERBOSE_TESTTRACE1(Js::FixedMethodsPhase))
                {
                    Output::Print(_u("FixedFields: invalidating guard: name: %s, value: 0x%p\n"),
                                  propertyRecord->GetBuffer(), guard->GetValue());
                    Output::Flush();
                }
            }

            return shouldRemove;
        });
    });
}